

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *pEVar1;
  BuildLog *this_00;
  Metrics *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  iterator __position;
  int64_t iVar6;
  undefined4 extraout_var;
  int *piVar7;
  char *pcVar8;
  undefined4 extraout_var_00;
  long lVar10;
  undefined4 extraout_var_02;
  Metric *pMVar11;
  bool bVar12;
  long lVar13;
  const_iterator o;
  long lVar14;
  pointer ppNVar15;
  allocator<char> local_129;
  Edge *edge;
  string *local_120;
  string rspfile;
  string deps_type;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ScopedMetric metrics_h_scoped;
  long lVar9;
  undefined4 extraout_var_01;
  
  local_120 = err;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar4 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_01 = g_metrics, iVar4 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar11 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&deps_type,"FinishCommand",(allocator<char> *)&deps_prefix);
      pMVar11 = Metrics::NewMetric(this_01,&deps_type);
      std::__cxx11::string::~string((string *)&deps_type);
    }
    FinishCommand::metrics_h_metric = pMVar11;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,FinishCommand::metrics_h_metric);
  pEVar1 = result->edge;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  edge = pEVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deps_prefix,"deps",(allocator<char> *)&rspfile);
  Edge::GetBinding(&deps_type,pEVar1,&deps_prefix);
  std::__cxx11::string::~string((string *)&deps_prefix);
  pEVar1 = edge;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"msvc_deps_prefix",(allocator<char> *)&local_60);
  Edge::GetBinding(&deps_prefix,pEVar1,&rspfile);
  std::__cxx11::string::~string((string *)&rspfile);
  if (deps_type._M_string_length != 0) {
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    rspfile._M_string_length = 0;
    rspfile.field_2._M_local_buf[0] = '\0';
    bVar2 = ExtractDeps(this,result,&deps_type,&deps_prefix,&deps_nodes,&rspfile);
    if ((!bVar2) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::append((string *)&result->output);
      result->status = ExitFailure;
    }
    std::__cxx11::string::~string((string *)&rspfile);
  }
  __position = std::
               _Rb_tree<const_Edge_*,_std::pair<const_Edge_*const,_int>,_std::_Select1st<std::pair<const_Edge_*const,_int>_>,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
               ::find(&(this->running_edges_)._M_t,&edge);
  iVar4 = *(int *)&__position._M_node[1]._M_parent;
  iVar6 = GetTimeMillis();
  lVar14 = iVar6 - this->start_time_millis_;
  std::
  _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
  ::erase_abi_cxx11_((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                      *)&this->running_edges_,__position);
  (*this->status_->_vptr_Status[2])
            (this->status_,edge,lVar14,(ulong)(result->status == ExitSuccess),&result->output);
  pEVar1 = edge;
  if (result->status != ExitSuccess) {
    bVar2 = Plan::EdgeFinished(&this->plan_,edge,kEdgeFailed,local_120);
    goto LAB_0010e469;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rspfile,"restat",(allocator<char> *)&local_60);
  bVar2 = Edge::GetBindingBool(pEVar1,&rspfile);
  std::__cxx11::string::~string((string *)&rspfile);
  if (this->config_->dry_run == false) {
    lVar13 = 0;
    bVar12 = false;
    for (ppNVar15 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppNVar15 !=
        (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar15 = ppNVar15 + 1) {
      iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[3])
                        (this->disk_interface_,*ppNVar15,local_120);
      lVar9 = CONCAT44(extraout_var_00,iVar5);
      if (lVar9 == -1) goto LAB_0010e467;
      if (lVar13 < lVar9) {
        lVar13 = lVar9;
      }
      if ((*ppNVar15)->mtime_ == lVar9 && bVar2) {
        bVar3 = Plan::CleanNode(&this->plan_,&this->scan_,*ppNVar15,local_120);
        bVar12 = true;
        if (!bVar3) goto LAB_0010e467;
      }
    }
    lVar9 = lVar13;
    if (!bVar12) goto LAB_0010e13c;
    lVar9 = 0;
    for (ppNVar15 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppNVar15 !=
        (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish + -(long)edge->order_only_deps_; ppNVar15 = ppNVar15 + 1)
    {
      iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[3])
                        (this->disk_interface_,*ppNVar15,local_120);
      lVar10 = CONCAT44(extraout_var_01,iVar5);
      if (lVar10 == -1) goto LAB_0010e467;
      if (lVar9 < lVar10) {
        lVar9 = lVar10;
      }
    }
    Edge::GetUnescapedDepfile_abi_cxx11_(&rspfile,edge);
    if (lVar9 == 0) {
      lVar9 = 0;
LAB_0010e434:
      bVar2 = true;
      (**this->status_->_vptr_Status)(this->status_,(ulong)(uint)(this->plan_).command_edges_);
    }
    else {
      if ((deps_type._M_string_length != 0) || (rspfile._M_string_length == 0)) goto LAB_0010e434;
      iVar5 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[3])
                        (this->disk_interface_,&rspfile,local_120);
      lVar10 = CONCAT44(extraout_var_02,iVar5);
      if (lVar9 < lVar10) {
        lVar9 = lVar10;
      }
      if (lVar10 != -1) goto LAB_0010e434;
      bVar2 = false;
      lVar9 = lVar13;
    }
    std::__cxx11::string::~string((string *)&rspfile);
    if (bVar2) goto LAB_0010e13c;
  }
  else {
    lVar9 = 0;
LAB_0010e13c:
    bVar2 = Plan::EdgeFinished(&this->plan_,edge,kEdgeSucceeded,local_120);
    if (bVar2) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&rspfile,edge);
      if ((rspfile._M_string_length != 0) && (g_keep_rsp == false)) {
        (*(this->disk_interface_->super_FileReader)._vptr_FileReader[6])
                  (this->disk_interface_,&rspfile);
      }
      this_00 = (this->scan_).build_log_;
      if ((this_00 == (BuildLog *)0x0) ||
         (bVar2 = BuildLog::RecordCommand(this_00,edge,iVar4,(int)lVar14,lVar9), bVar2)) {
        bVar2 = true;
        if ((deps_type._M_string_length != 0) && (this->config_->dry_run == false)) {
          ppNVar15 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (ppNVar15 ==
              (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                          ,899,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          do {
            bVar2 = ppNVar15 ==
                    (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
            if (bVar2) goto LAB_0010e3d7;
            iVar4 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[3])
                              (this->disk_interface_,*ppNVar15,local_120);
            if (CONCAT44(extraout_var,iVar4) == -1) goto LAB_0010e3d7;
            bVar2 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,*ppNVar15,
                                        CONCAT44(extraout_var,iVar4),&deps_nodes);
            ppNVar15 = ppNVar15 + 1;
          } while (bVar2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"Error writing to deps log: ",&local_129);
          piVar7 = __errno_location();
          pcVar8 = strerror(*piVar7);
          std::operator+(&local_60,&local_80,pcVar8);
          goto LAB_0010e3ab;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Error writing to build log: ",&local_129);
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        std::operator+(&local_60,&local_80,pcVar8);
LAB_0010e3ab:
        std::__cxx11::string::operator=((string *)local_120,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        bVar2 = false;
      }
LAB_0010e3d7:
      std::__cxx11::string::~string((string *)&rspfile);
      goto LAB_0010e469;
    }
  }
LAB_0010e467:
  bVar2 = false;
LAB_0010e469:
  std::__cxx11::string::~string((string *)&deps_prefix);
  std::__cxx11::string::~string((string *)&deps_type);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&deps_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return bVar2;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int64_t start_time_millis, end_time_millis;
  RunningEdgeMap::iterator it = running_edges_.find(edge);
  start_time_millis = it->second;
  end_time_millis = GetTimeMillis() - start_time_millis_;
  running_edges_.erase(it);

  status_->BuildEdgeFinished(edge, end_time_millis, result->success(),
                             result->output);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time_millis,
                                          end_time_millis, output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}